

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall ProblemTest_Complementarity_Test::TestBody(ProblemTest_Complementarity_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  Variable VVar3;
  MutAlgebraicCon MVar4;
  AssertionFailure *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_3;
  AssertionFailure *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_2;
  AssertionFailure *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  AssertionFailure *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Problem p;
  undefined8 in_stack_fffffffffffff938;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff940;
  int in_stack_fffffffffffff94c;
  ComplInfo *in_stack_fffffffffffff950;
  int in_stack_fffffffffffff95c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff968;
  Type in_stack_fffffffffffff96c;
  AssertionResult *in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff978;
  Type in_stack_fffffffffffff97c;
  undefined4 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff980;
  double in_stack_fffffffffffff988;
  int in_stack_fffffffffffff990;
  int in_stack_fffffffffffff994;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff9a0;
  ComplInfo in_stack_fffffffffffff9a4;
  char *in_stack_fffffffffffff9a8;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  AssertionResult *in_stack_fffffffffffff9b8;
  undefined7 in_stack_fffffffffffff9c0;
  undefined1 in_stack_fffffffffffff9c7;
  double in_stack_fffffffffffff9f0;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffa00;
  undefined1 local_559 [33];
  AssertionResult local_538 [3];
  byte local_502;
  undefined1 local_501 [33];
  AssertionResult local_4e0 [3];
  byte local_4aa;
  allocator<char> local_4a9;
  string local_4a8 [32];
  AssertionResult local_488 [3];
  int local_454;
  byte local_44a;
  allocator<char> local_449;
  string local_448 [32];
  AssertionResult local_428;
  string local_418 [48];
  AssertionResult local_3e8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3d0;
  int local_3c8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3c0;
  int local_3b8;
  string local_3b0 [64];
  AssertionResult local_370 [55];
  
  uVar2 = (undefined1)((ulong)in_stack_fffffffffffff938 >> 0x38);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(in_stack_fffffffffffff960);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::HasComplementarity
            ((BasicProblem<mp::BasicProblemParams<int>_> *)0x12d181);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffff940,(bool)uVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff970);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9b8,
               (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               in_stack_fffffffffffff9a8,
               (char *)CONCAT44(in_stack_fffffffffffff9a4.flags_,in_stack_fffffffffffff9a0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
               (char *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c,
               (char *)in_stack_fffffffffffff950);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
               (Message *)in_stack_fffffffffffff9b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff940);
    std::__cxx11::string::~string(local_3b0);
    testing::Message::~Message((Message *)0x12d298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d313);
  VVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                     in_stack_fffffffffffff988,(double)in_stack_fffffffffffff980,
                     in_stack_fffffffffffff97c);
  local_3c0 = VVar3.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_3b8 = VVar3.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  MVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
                    (in_stack_fffffffffffffa00,
                     (double)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
                     in_stack_fffffffffffff9f0);
  local_3d0 = MVar4.
              super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3c8 = MVar4.
              super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  mp::ComplInfo::ComplInfo(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity
            (in_stack_fffffffffffff998,in_stack_fffffffffffff994,in_stack_fffffffffffff990,
             in_stack_fffffffffffff9a4);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::HasComplementarity
            ((BasicProblem<mp::BasicProblemParams<int>_> *)0x12d3db);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffff940,(bool)uVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff970);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9b8,
               (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               in_stack_fffffffffffff9a8,
               (char *)CONCAT44(in_stack_fffffffffffff9a4.flags_,in_stack_fffffffffffff9a0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
               (char *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c,
               (char *)in_stack_fffffffffffff950);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
               (Message *)in_stack_fffffffffffff9b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff940);
    std::__cxx11::string::~string(local_418);
    testing::Message::~Message((Message *)0x12d4e9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d564);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_428);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff980,
               (char *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
               (allocator<char> *)in_stack_fffffffffffff970);
    std::allocator<char>::~allocator(&local_449);
    local_44a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::ComplInfo::ComplInfo(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
      mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity
                (in_stack_fffffffffffff998,in_stack_fffffffffffff994,in_stack_fffffffffffff990,
                 in_stack_fffffffffffff9a4);
    }
    if ((local_44a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff970,
                 (char (*) [127])CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
      local_454 = 2;
    }
    else {
      local_454 = 0;
    }
    std::__cxx11::string::~string(local_448);
    if (local_454 != 0) goto LAB_0012d8fc;
  }
  else {
LAB_0012d8fc:
    testing::Message::Message((Message *)in_stack_fffffffffffff970);
    testing::AssertionResult::failure_message((AssertionResult *)0x12d918);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
               (char *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c,
               (char *)in_stack_fffffffffffff950);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
               (Message *)in_stack_fffffffffffff9b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff940);
    testing::Message::~Message((Message *)0x12d97b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d9d3);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_488);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff980,
               (char *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
               (allocator<char> *)in_stack_fffffffffffff970);
    std::allocator<char>::~allocator(&local_4a9);
    local_4aa = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::ComplInfo::ComplInfo(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
      mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity
                (in_stack_fffffffffffff998,in_stack_fffffffffffff994,in_stack_fffffffffffff990,
                 in_stack_fffffffffffff9a4);
    }
    if ((local_4aa & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff970,
                 (char (*) [126])CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
      local_454 = 3;
    }
    else {
      local_454 = 0;
    }
    std::__cxx11::string::~string(local_4a8);
    if (local_454 != 0) goto LAB_0012dd6b;
  }
  else {
LAB_0012dd6b:
    testing::Message::Message((Message *)in_stack_fffffffffffff970);
    testing::AssertionResult::failure_message((AssertionResult *)0x12dd87);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
               (char *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c,
               (char *)in_stack_fffffffffffff950);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
               (Message *)in_stack_fffffffffffff9b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff940);
    testing::Message::~Message((Message *)0x12ddea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12de42);
  testing::AssertionSuccess();
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_4e0);
  if ((bool)uVar2) {
    in_stack_fffffffffffff9b8 = (AssertionResult *)local_501;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff980,
               (char *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
               (allocator<char> *)in_stack_fffffffffffff970);
    std::allocator<char>::~allocator((allocator<char> *)local_501);
    local_502 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::ComplInfo::ComplInfo(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
      mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity
                (in_stack_fffffffffffff998,in_stack_fffffffffffff994,in_stack_fffffffffffff990,
                 in_stack_fffffffffffff9a4);
    }
    if ((local_502 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff970,
                 (char (*) [127])CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
      local_454 = 4;
    }
    else {
      local_454 = 0;
    }
    std::__cxx11::string::~string((string *)(local_501 + 1));
    if (local_454 != 0) goto LAB_0012e1b0;
  }
  else {
LAB_0012e1b0:
    testing::Message::Message((Message *)in_stack_fffffffffffff970);
    in_stack_fffffffffffff980 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x12e1cc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
               (char *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c,
               (char *)in_stack_fffffffffffff950);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff9c0),
               (Message *)in_stack_fffffffffffff9b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff940);
    testing::Message::~Message((Message *)0x12e229);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e281);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_538);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff97c);
  if (bVar1) {
    in_stack_fffffffffffff970 = (AssertionResult *)local_559;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff980,(char *)CONCAT44(uVar5,in_stack_fffffffffffff978),
               (allocator<char> *)in_stack_fffffffffffff970);
    std::allocator<char>::~allocator((allocator<char> *)local_559);
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffff96c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff96c);
    if (bVar1) {
      mp::ComplInfo::ComplInfo(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
      mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity
                (in_stack_fffffffffffff998,in_stack_fffffffffffff994,in_stack_fffffffffffff990,
                 in_stack_fffffffffffff9a4);
    }
    testing::AssertionResult::operator<<
              (in_stack_fffffffffffff970,
               (char (*) [126])CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
    local_454 = 5;
    std::__cxx11::string::~string((string *)(local_559 + 1));
    if (local_454 == 0) goto LAB_0012e6a2;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffff970);
  testing::AssertionResult::failure_message((AssertionResult *)0x12e5ff);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
             (char *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c,
             (char *)in_stack_fffffffffffff950);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff9c0),
             (Message *)in_stack_fffffffffffff9b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff940);
  testing::Message::~Message((Message *)0x12e65a);
LAB_0012e6a2:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e6af);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(in_stack_fffffffffffff940);
  return;
}

Assistant:

TEST(ProblemTest, Complementarity) {
  Problem p;
  EXPECT_FALSE(p.HasComplementarity());
  p.AddVar(0, 1);
  p.AddCon(0, 1);
  using mp::ComplInfo;
  p.SetComplementarity(0, 0, ComplInfo(0));
  EXPECT_TRUE(p.HasComplementarity());
  EXPECT_ASSERT(p.SetComplementarity(-1, 0, ComplInfo(0)), "invalid index");
  EXPECT_ASSERT(p.SetComplementarity(1, 0, ComplInfo(0)), "invalid index");
  EXPECT_ASSERT(p.SetComplementarity(0, -1, ComplInfo(0)), "invalid index");
  EXPECT_ASSERT(p.SetComplementarity(0, 1, ComplInfo(0)), "invalid index");
}